

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O3

RK_S32 mpi_enc_opt_atr_p(void *ctx,char *next)

{
  int iVar1;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_enc_utils","invalid atr_str_p\n",0);
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0xc0) = iVar1;
  }
  return (uint)(next != (char *)0x0);
}

Assistant:

RK_S32 mpi_enc_opt_atr_p(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    if (next) {
        cmd->atr_str_p = atoi(next);
        return 1;
    }

    mpp_err("invalid atr_str_p\n");
    return 0;
}